

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O0

void __thiscall
QArrayDataPointer<QRectF>::relocate(QArrayDataPointer<QRectF> *this,qsizetype offset,QRectF **data)

{
  bool bVar1;
  long *in_RDX;
  long in_RSI;
  QArrayDataPointer<QRectF> *in_RDI;
  QRectF **unaff_retaddr;
  QRectF *res;
  QRectF *first;
  QArrayDataPointer<QRectF> *c;
  
  first = in_RDI->ptr + in_RSI;
  c = in_RDI;
  QtPrivate::q_relocate_overlap_n<QRectF,long_long>(first,(longlong)in_RDI,(QRectF *)0x9adf27);
  if ((in_RDX != (long *)0x0) &&
     (bVar1 = QtPrivate::q_points_into_range<QArrayDataPointer<QRectF>,QRectF_const*>
                        (unaff_retaddr,c), bVar1)) {
    *in_RDX = in_RSI * 0x20 + *in_RDX;
  }
  in_RDI->ptr = first;
  return;
}

Assistant:

void relocate(qsizetype offset, const T **data = nullptr)
    {
        T *res = this->ptr + offset;
        QtPrivate::q_relocate_overlap_n(this->ptr, this->size, res);
        // first update data pointer, then this->ptr
        if (data && QtPrivate::q_points_into_range(*data, *this))
            *data += offset;
        this->ptr = res;
    }